

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O0

void bitrevR2(float *ioptr,long M,short *BRLow)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  short sVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long in_RDX;
  long in_RSI;
  ulong in_RDI;
  float f7i;
  float f7r;
  float f6i;
  float f6r;
  float f5i;
  float f5r;
  float f4i;
  float f4r;
  float f3i;
  float f3r;
  float f2i;
  float f2r;
  float f1i;
  float f1r;
  float f0i;
  float f0r;
  long local_98;
  long local_90;
  unsigned_long ColstartShift;
  unsigned_long Nroot_1;
  unsigned_long Nroot_1_ColInc;
  unsigned_long Nrems2;
  unsigned_long posBi;
  unsigned_long posB;
  unsigned_long posAi;
  unsigned_long posA;
  long iCol;
  long Colstart;
  float *iolimit;
  float *IOP;
  float *p1r;
  float *p0r;
  float t1i;
  float t1r;
  float t0i;
  float t0r;
  
  lVar14 = 1L << ((byte)((in_RSI + 3) / 2) & 0x3f);
  lVar15 = (1L << ((char)(in_RSI / 2) - 1U & 0x3f)) + -1;
  lVar16 = 1L << ((byte)in_RSI & 0x3f);
  lVar17 = lVar16 + 1;
  lVar18 = lVar16 + 2;
  lVar19 = lVar16 + 3;
  for (_t0i = in_RDI; local_90 = lVar15, _t0i < in_RDI + lVar14 * 4;
      _t0i = (1L << ((char)(in_RSI / 2) + 1U & 0x3f)) * 4 + _t0i) {
    for (; -1 < local_90; local_90 = local_90 + -1) {
      Nroot_1_ColInc =
           _t0i + ((1L << ((byte)in_RSI & 0x3f)) - lVar14) * 4 +
           (long)((int)*(short *)(in_RDX + local_90 * 2) << 2) * 4;
      sVar13 = *(short *)(in_RDX + lVar15 * 2);
      p1r._4_4_ = *(float *)Nroot_1_ColInc;
      p1r._0_4_ = *(float *)(Nroot_1_ColInc + 4);
      IOP._4_4_ = *(float *)(Nroot_1_ColInc + lVar16 * 4);
      IOP._0_4_ = *(float *)(Nroot_1_ColInc + lVar17 * 4);
      local_98 = lVar15;
      while (Nroot_1 = _t0i + (local_90 << ((char)((in_RSI + 1) / 2) + 1U & 0x3f)) * 4 +
                       (long)((int)sVar13 << 2) * 4, local_90 < local_98) {
        fVar1 = *(float *)(Nroot_1_ColInc + 8);
        fVar2 = *(float *)(Nroot_1_ColInc + 0xc);
        fVar3 = *(float *)(Nroot_1_ColInc + lVar18 * 4);
        fVar4 = *(float *)(Nroot_1_ColInc + lVar19 * 4);
        fVar5 = *(float *)Nroot_1;
        fVar6 = *(float *)(Nroot_1 + 4);
        fVar7 = *(float *)(Nroot_1 + lVar16 * 4);
        fVar8 = *(float *)(Nroot_1 + lVar17 * 4);
        fVar9 = *(float *)(Nroot_1 + 8);
        fVar10 = *(float *)(Nroot_1 + 0xc);
        fVar11 = *(float *)(Nroot_1 + lVar18 * 4);
        fVar12 = *(float *)(Nroot_1 + lVar19 * 4);
        *(float *)Nroot_1 = p1r._4_4_ + IOP._4_4_;
        *(float *)(Nroot_1 + 4) = p1r._0_4_ + IOP._0_4_;
        *(float *)(Nroot_1 + 8) = p1r._4_4_ - IOP._4_4_;
        *(float *)(Nroot_1 + 0xc) = p1r._0_4_ - IOP._0_4_;
        *(float *)(Nroot_1 + lVar16 * 4) = fVar1 + fVar3;
        *(float *)(Nroot_1 + lVar17 * 4) = fVar2 + fVar4;
        *(float *)(Nroot_1 + lVar18 * 4) = fVar1 - fVar3;
        *(float *)(Nroot_1 + lVar19 * 4) = fVar2 - fVar4;
        *(float *)Nroot_1_ColInc = fVar5 + fVar7;
        *(float *)(Nroot_1_ColInc + 4) = fVar6 + fVar8;
        *(float *)(Nroot_1_ColInc + 8) = fVar5 - fVar7;
        *(float *)(Nroot_1_ColInc + 0xc) = fVar6 - fVar8;
        *(float *)(Nroot_1_ColInc + lVar16 * 4) = fVar9 + fVar11;
        *(float *)(Nroot_1_ColInc + lVar17 * 4) = fVar10 + fVar12;
        *(float *)(Nroot_1_ColInc + lVar18 * 4) = fVar9 - fVar11;
        *(float *)(Nroot_1_ColInc + lVar19 * 4) = fVar10 - fVar12;
        Nroot_1_ColInc = Nroot_1_ColInc + lVar14 * -4;
        p1r._4_4_ = *(float *)Nroot_1_ColInc;
        p1r._0_4_ = *(float *)(Nroot_1_ColInc + 4);
        IOP._4_4_ = *(float *)(Nroot_1_ColInc + lVar16 * 4);
        IOP._0_4_ = *(float *)(Nroot_1_ColInc + lVar17 * 4);
        local_98 = local_98 + -1;
        sVar13 = *(short *)(in_RDX + local_98 * 2);
      }
      fVar1 = *(float *)(Nroot_1_ColInc + 8);
      fVar2 = *(float *)(Nroot_1_ColInc + 0xc);
      fVar3 = *(float *)(Nroot_1_ColInc + lVar18 * 4);
      fVar4 = *(float *)(Nroot_1_ColInc + lVar19 * 4);
      *(float *)Nroot_1_ColInc = p1r._4_4_ + IOP._4_4_;
      *(float *)(Nroot_1_ColInc + 4) = p1r._0_4_ + IOP._0_4_;
      *(float *)(Nroot_1_ColInc + 8) = p1r._4_4_ - IOP._4_4_;
      *(float *)(Nroot_1_ColInc + 0xc) = p1r._0_4_ - IOP._0_4_;
      *(float *)(Nroot_1_ColInc + lVar16 * 4) = fVar1 + fVar3;
      *(float *)(Nroot_1_ColInc + lVar17 * 4) = fVar2 + fVar4;
      *(float *)(Nroot_1_ColInc + lVar18 * 4) = fVar1 - fVar3;
      *(float *)(Nroot_1_ColInc + lVar19 * 4) = fVar2 - fVar4;
    }
  }
  return;
}

Assistant:

static inline void bitrevR2(float *ioptr, long M, short *BRLow) {
/*** bit reverse and first radix 2 stage of forward or inverse fft ***/
float	f0r;
float	f0i;
float	f1r;
float	f1i;
float	f2r;
float	f2i;
float	f3r;
float	f3i;
float	f4r;
float	f4i;
float	f5r;
float	f5i;
float	f6r;
float	f6i;
float	f7r;
float	f7i;
float	t0r;
float	t0i;
float	t1r;
float	t1i;
float	*p0r;
float	*p1r;
float	*IOP;
float 	*iolimit;
long 	Colstart;
long 	iCol;
unsigned long 	posA;
unsigned long 	posAi;
unsigned long 	posB;
unsigned long 	posBi;

const unsigned long Nrems2 = POW2((M+3)/2);
const unsigned long Nroot_1_ColInc = POW2(M)-Nrems2;
const unsigned long Nroot_1 = POW2(M/2-1)-1;
const unsigned long ColstartShift = (M+1)/2 +1;
posA = POW2(M);		// 1/2 of POW2(M) complexes
posAi = posA + 1;
posB = posA + 2;
posBi = posB + 1;

iolimit = ioptr + Nrems2;
for (; ioptr < iolimit; ioptr += POW2(M/2+1)){
	for (Colstart = Nroot_1; Colstart >= 0; Colstart--){
		iCol = Nroot_1;
		p0r = ioptr+ Nroot_1_ColInc + BRLow[Colstart]*4;
		IOP = ioptr + (Colstart << ColstartShift);
		p1r = IOP + BRLow[iCol]*4;
		f0r = *(p0r);
		f0i = *(p0r+1);
		f1r = *(p0r+posA);
		f1i = *(p0r+posAi);
		for (; iCol > Colstart;){
			f2r = *(p0r+2);
			f2i = *(p0r+(2+1));
			f3r = *(p0r+posB);
			f3i = *(p0r+posBi);
			f4r = *(p1r);
			f4i = *(p1r+1);
			f5r = *(p1r+posA);
			f5i = *(p1r+posAi);
			f6r = *(p1r+2);
			f6i = *(p1r+(2+1));
			f7r = *(p1r+posB);
			f7i = *(p1r+posBi);
			
			t0r	= f0r + f1r;
			t0i	= f0i + f1i;
			f1r = f0r - f1r;
			f1i = f0i - f1i;
			t1r = f2r + f3r;
			t1i = f2i + f3i;
			f3r = f2r - f3r;
			f3i = f2i - f3i;
			f0r = f4r + f5r;
			f0i = f4i + f5i;
			f5r = f4r - f5r;
			f5i = f4i - f5i;
			f2r = f6r + f7r;
			f2i = f6i + f7i;
			f7r = f6r - f7r;
			f7i = f6i - f7i;

			*(p1r) = t0r;
			*(p1r+1) = t0i;
			*(p1r+2) = f1r;
			*(p1r+(2+1)) = f1i;
			*(p1r+posA) = t1r;
			*(p1r+posAi) = t1i;
			*(p1r+posB) = f3r;
			*(p1r+posBi) = f3i;
			*(p0r) = f0r;
			*(p0r+1) = f0i;
			*(p0r+2) = f5r;
			*(p0r+(2+1)) = f5i;
			*(p0r+posA) = f2r;
			*(p0r+posAi) = f2i;
			*(p0r+posB) = f7r;
			*(p0r+posBi) = f7i;

			p0r -= Nrems2;
			f0r = *(p0r);
			f0i = *(p0r+1);
			f1r = *(p0r+posA);
			f1i = *(p0r+posAi);
			iCol -= 1;
			p1r = IOP + BRLow[iCol]*4;
		};
		f2r = *(p0r+2);
		f2i = *(p0r+(2+1));
		f3r = *(p0r+posB);
		f3i = *(p0r+posBi);

		t0r   = f0r + f1r;
		t0i   = f0i + f1i;
		f1r = f0r - f1r;
		f1i = f0i - f1i;
		t1r   = f2r + f3r;
		t1i   = f2i + f3i;
		f3r = f2r - f3r;
		f3i = f2i - f3i;

		*(p0r) = t0r;
		*(p0r+1) = t0i;
		*(p0r+2) = f1r;
		*(p0r+(2+1)) = f1i;
		*(p0r+posA) = t1r;
		*(p0r+posAi) = t1i;
		*(p0r+posB) = f3r;
		*(p0r+posBi) = f3i;

	};
};
}